

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

QuotingType __thiscall llvm::yaml::needsQuotes(yaml *this,StringRef S)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  iterator pcVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  StringRef S_00;
  StringRef S_01;
  StringRef S_02;
  uchar C;
  iterator __end2;
  iterator __begin2;
  StringRef *__range2;
  undefined1 auStack_60 [4];
  QuotingType MaxQuotingNeeded;
  yaml *local_50;
  char *local_48;
  yaml *local_40;
  char *local_38;
  yaml *local_30;
  char *local_28;
  undefined1 local_20 [8];
  StringRef S_local;
  
  S_local.Data = S.Data;
  local_20 = (undefined1  [8])this;
  bVar1 = StringRef::empty((StringRef *)local_20);
  if (!bVar1) {
    bVar2 = StringRef::front((StringRef *)local_20);
    iVar3 = isspace((uint)bVar2);
    if (iVar3 == 0) {
      bVar2 = StringRef::back((StringRef *)local_20);
      iVar3 = isspace((uint)bVar2);
      if (iVar3 == 0) {
        local_30 = (yaml *)local_20;
        local_28 = S_local.Data;
        S_00.Length = extraout_RDX;
        S_00.Data = S_local.Data;
        bVar1 = isNull((yaml *)local_20,S_00);
        if (bVar1) {
          return Single;
        }
        local_40 = (yaml *)local_20;
        local_38 = S_local.Data;
        S_01.Length = extraout_RDX_00;
        S_01.Data = S_local.Data;
        bVar1 = isBool((yaml *)local_20,S_01);
        if (bVar1) {
          return Single;
        }
        local_50 = (yaml *)local_20;
        local_48 = S_local.Data;
        S_02.Length = extraout_RDX_01;
        S_02.Data = S_local.Data;
        bVar1 = isNumeric((yaml *)local_20,S_02);
        if (bVar1) {
          return Single;
        }
        StringRef::StringRef((StringRef *)auStack_60,"-?:\\,[]{}#&*!|>\'\"%@`");
        sVar5 = StringRef::find_first_of((StringRef *)local_20,_auStack_60,0);
        if (sVar5 == 0) {
          return Single;
        }
        __range2._4_4_ = None;
        __end2 = StringRef::begin((StringRef *)local_20);
        pcVar6 = StringRef::end((StringRef *)local_20);
        do {
          if (__end2 == pcVar6) {
            return __range2._4_4_;
          }
          bVar2 = *__end2;
          bVar1 = isAlnum(bVar2);
          if ((!bVar1) && (uVar4 = (uint)bVar2, uVar4 != 9)) {
            if ((uVar4 == 10) || (uVar4 == 0xd)) {
              __range2._4_4_ = Single;
            }
            else if ((uVar4 != 0x20) && (2 < uVar4 - 0x2c)) {
              if (uVar4 != 0x2f) {
                if (uVar4 - 0x5e < 2) goto LAB_0208a980;
                if (uVar4 == 0x7f) {
                  return Double;
                }
              }
              if (bVar2 < 0x20) {
                return Double;
              }
              if ((bVar2 & 0x80) != 0) {
                return Double;
              }
              __range2._4_4_ = Single;
            }
          }
LAB_0208a980:
          __end2 = __end2 + 1;
        } while( true );
      }
    }
  }
  return Single;
}

Assistant:

inline QuotingType needsQuotes(StringRef S) {
  if (S.empty())
    return QuotingType::Single;
  if (isspace(static_cast<unsigned char>(S.front())) ||
      isspace(static_cast<unsigned char>(S.back())))
    return QuotingType::Single;
  if (isNull(S))
    return QuotingType::Single;
  if (isBool(S))
    return QuotingType::Single;
  if (isNumeric(S))
    return QuotingType::Single;

  // 7.3.3 Plain Style
  // Plain scalars must not begin with most indicators, as this would cause
  // ambiguity with other YAML constructs.
  static constexpr char Indicators[] = R"(-?:\,[]{}#&*!|>'"%@`)";
  if (S.find_first_of(Indicators) == 0)
    return QuotingType::Single;

  QuotingType MaxQuotingNeeded = QuotingType::None;
  for (unsigned char C : S) {
    // Alphanum is safe.
    if (isAlnum(C))
      continue;

    switch (C) {
    // Safe scalar characters.
    case '_':
    case '-':
    case '^':
    case '.':
    case ',':
    case ' ':
    // TAB (0x9) is allowed in unquoted strings.
    case 0x9:
      continue;
    // LF(0xA) and CR(0xD) may delimit values and so require at least single
    // quotes.
    case 0xA:
    case 0xD:
      MaxQuotingNeeded = QuotingType::Single;
      continue;
    // DEL (0x7F) are excluded from the allowed character range.
    case 0x7F:
      return QuotingType::Double;
    // Forward slash is allowed to be unquoted, but we quote it anyway.  We have
    // many tests that use FileCheck against YAML output, and this output often
    // contains paths.  If we quote backslashes but not forward slashes then
    // paths will come out either quoted or unquoted depending on which platform
    // the test is run on, making FileCheck comparisons difficult.
    case '/':
    default: {
      // C0 control block (0x0 - 0x1F) is excluded from the allowed character
      // range.
      if (C <= 0x1F)
        return QuotingType::Double;

      // Always double quote UTF-8.
      if ((C & 0x80) != 0)
        return QuotingType::Double;

      // The character is not safe, at least simple quoting needed.
      MaxQuotingNeeded = QuotingType::Single;
    }
    }
  }

  return MaxQuotingNeeded;
}